

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O2

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinPC07_K,void>::
eval_exc_inc_<double&,int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinPC07_K,void> *this,double *args,int *args_1,
          double **args_2,double **args_3,double **args_4,double **args_5,double **args_6)

{
  double scal_fact;
  uint N;
  const_host_buffer_type rho;
  const_host_buffer_type sigma;
  const_host_buffer_type lapl;
  const_host_buffer_type tau;
  host_buffer_type eps;
  ulong uVar1;
  ulong uVar2;
  double dStack_38;
  
  scal_fact = *args;
  N = *args_1;
  rho = *args_2;
  sigma = *args_3;
  lapl = *args_4;
  tau = *args_5;
  eps = *args_6;
  if (*(int *)(this + 8) == 0) {
    host_eval_exc_inc_helper_polar<ExchCXX::BuiltinPC07_K>(scal_fact,N,rho,sigma,lapl,tau,eps);
    return;
  }
  uVar2 = 0;
  uVar1 = (ulong)N;
  if ((int)N < 1) {
    uVar1 = uVar2;
  }
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    mgga_screening_interface<ExchCXX::BuiltinPC07_K>::eval_exc_unpolar
              (rho[uVar2],sigma[uVar2],lapl[uVar2],tau[uVar2],&dStack_38);
    eps[uVar2] = dStack_38 * scal_fact + eps[uVar2];
  }
  return;
}

Assistant:

void eval_exc_inc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_inc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_inc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }